

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O0

bool __thiscall stk::FileRead::getMatInfo(FileRead *this,char *fileName)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  unsigned_long uVar5;
  ostream *poVar6;
  double dVar7;
  int local_88;
  int local_84;
  SINT32 type_1;
  SINT32 namesize_1;
  FLOAT64 rate_7;
  uint local_70;
  FLOAT32 rate_6;
  UINT32 rate_5;
  SINT32 rate_4;
  UINT16 rate_3;
  SINT16 rate_2;
  uchar rate_1;
  double dStack_60;
  char rate;
  StkFloat srate;
  char local_4f [2];
  undefined1 local_4d;
  UINT32 type;
  char name [3];
  long lStack_48;
  SINT32 namesize;
  long dataoffset;
  int local_38;
  SINT32 nametype;
  SINT32 columns;
  SINT32 rows;
  SINT32 chunkSize;
  bool haveSampleRate;
  bool haveData;
  bool doneParsing;
  char mi [2];
  char head [5];
  char *fileName_local;
  FileRead *this_local;
  
  _doneParsing = fileName;
  iVar2 = fseek((FILE *)this->fd_,0,0);
  if ((iVar2 != -1) &&
     (sVar3 = fread((void *)((long)&chunkSize + 3),4,1,(FILE *)this->fd_), sVar3 == 1)) {
    haveData = false;
    pcVar4 = strstr((char *)((long)&chunkSize + 3),"0");
    if (pcVar4 != (char *)0x0) {
      poVar6 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead: ");
      poVar6 = std::operator<<(poVar6,_doneParsing);
      std::operator<<(poVar6,
                      " appears to be a Version 4 MAT-file, which is not currently supported.");
      return false;
    }
    this->byteswap_ = false;
    iVar2 = fseek((FILE *)this->fd_,0x7e,0);
    if ((iVar2 != -1) &&
       (sVar3 = fread((void *)((long)&chunkSize + 1),2,1,(FILE *)this->fd_), sVar3 == 1)) {
      iVar2 = strncmp((char *)((long)&chunkSize + 1),"MI",2);
      if (iVar2 == 0) {
        this->byteswap_ = true;
      }
      else {
        iVar2 = strncmp((char *)((long)&chunkSize + 1),"IM",2);
        if (iVar2 != 0) goto LAB_00117efb;
      }
      chunkSize._0_1_ = 0;
      rows._3_1_ = 0;
      rows._2_1_ = 0;
LAB_00117753:
      do {
        if ((((byte)chunkSize ^ 0xff) & 1) == 0) {
          return true;
        }
        lStack_48 = ftell((FILE *)this->fd_);
        bVar1 = findNextMatArray(this,&columns,&nametype,&local_38,(SINT32 *)((long)&dataoffset + 4)
                                );
        if (!bVar1) {
          if ((rows._3_1_ & 1) == 0) {
            poVar6 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                     "FileRead: No audio data found in MAT-file (");
            poVar6 = std::operator<<(poVar6,_doneParsing);
            std::operator<<(poVar6,").");
            return false;
          }
          if ((rows._2_1_ & 1) == 0) {
            this->fileRate_ = 44100.0;
            std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                            "FileRead: No sample rate found ... assuming 44100.0");
            Stk::handleError(&this->super_Stk,WARNING);
            return true;
          }
          return true;
        }
        if ((((rows._2_1_ & 1) == 0) && (nametype == 1)) && (local_38 == 1)) {
          type = 4;
          if (dataoffset._4_4_ == 1) {
            sVar3 = fread(&type,4,1,(FILE *)this->fd_);
            if (sVar3 != 1) break;
            if ((this->byteswap_ & 1U) != 0) {
              Stk::swap32((uchar *)&type);
            }
            if (type != 2) goto LAB_00117eb4;
            type = 8;
          }
          local_4d = 0;
          sVar3 = fread(local_4f,2,1,(FILE *)this->fd_);
          if (sVar3 != 1) break;
          iVar2 = strncmp(local_4f,"fs",2);
          if (iVar2 == 0) {
            iVar2 = fseek((FILE *)this->fd_,(long)(int)(type - 2),1);
            if ((iVar2 == -1) ||
               (sVar3 = fread((void *)((long)&srate + 4),4,1,(FILE *)this->fd_), sVar3 != 1)) break;
            if ((this->byteswap_ & 1U) != 0) {
              Stk::swap32((uchar *)((long)&srate + 4));
            }
            if ((srate._4_4_ & 0xffff0000) == 0) {
              iVar2 = fseek((FILE *)this->fd_,4,1);
              if (iVar2 == -1) break;
            }
            else {
              srate._4_4_ = srate._4_4_ & 0xffff;
            }
            if (srate._4_4_ == 1) {
              sVar3 = fread((void *)((long)&rate_4 + 3),1,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              dStack_60 = (double)(int)rate_4._3_1_;
            }
            else if (srate._4_4_ == 2) {
              sVar3 = fread((void *)((long)&rate_4 + 2),1,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              dStack_60 = (double)rate_4._2_1_;
            }
            else if (srate._4_4_ == 3) {
              sVar3 = fread(&rate_4,2,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              if ((this->byteswap_ & 1U) != 0) {
                Stk::swap16((uchar *)&rate_4);
              }
              dStack_60 = (double)(int)(short)rate_4;
            }
            else if (srate._4_4_ == 4) {
              sVar3 = fread((void *)((long)&rate_5 + 2),2,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              if ((this->byteswap_ & 1U) != 0) {
                Stk::swap16((uchar *)((long)&rate_5 + 2));
              }
              dStack_60 = (double)rate_5._2_2_;
            }
            else if (srate._4_4_ == 5) {
              sVar3 = fread(&rate_6,4,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              if ((this->byteswap_ & 1U) != 0) {
                Stk::swap32((uchar *)&rate_6);
              }
              dStack_60 = (double)(int)rate_6;
            }
            else if (srate._4_4_ == 6) {
              sVar3 = fread(&local_70,4,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              if ((this->byteswap_ & 1U) != 0) {
                Stk::swap32((uchar *)&local_70);
              }
              dStack_60 = (double)local_70;
            }
            else if (srate._4_4_ == 7) {
              sVar3 = fread((void *)((long)&rate_7 + 4),4,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              if ((this->byteswap_ & 1U) != 0) {
                Stk::swap32((uchar *)((long)&rate_7 + 4));
              }
              dStack_60 = (double)rate_7._4_4_;
            }
            else {
              if (srate._4_4_ != 9) goto LAB_00117eb4;
              sVar3 = fread(&type_1,8,1,(FILE *)this->fd_);
              if (sVar3 != 1) break;
              if ((this->byteswap_ & 1U) != 0) {
                Stk::swap64((uchar *)&type_1);
              }
              dStack_60 = _type_1;
            }
            if (0.0 < dStack_60) {
              this->fileRate_ = dStack_60;
            }
            rows._2_1_ = 1;
          }
        }
        else if ((rows._3_1_ & 1) == 0) {
          if (local_38 <= nametype) {
            std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                            "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns)."
                           );
            return false;
          }
          this->channels_ = nametype;
          this->fileSize_ = (long)local_38;
          local_84 = 4;
          if (dataoffset._4_4_ == 1) {
            sVar3 = fread(&local_84,4,1,(FILE *)this->fd_);
            if (sVar3 != 1) break;
            if ((this->byteswap_ & 1U) != 0) {
              Stk::swap32((uchar *)&local_84);
            }
            dVar7 = ceil((double)((float)local_84 / 8.0));
            local_84 = (int)dVar7;
            iVar2 = fseek((FILE *)this->fd_,(long)(local_84 << 3),1);
          }
          else {
            iVar2 = fseek((FILE *)this->fd_,4,1);
          }
          if ((iVar2 == -1) || (sVar3 = fread(&local_88,4,1,(FILE *)this->fd_), sVar3 != 1)) break;
          if ((this->byteswap_ & 1U) != 0) {
            Stk::swap32((uchar *)&local_88);
          }
          if (local_88 == 1) {
            this->dataType_ = 1;
          }
          else if (local_88 == 3) {
            this->dataType_ = 2;
          }
          else if (local_88 == 5) {
            this->dataType_ = 8;
          }
          else if (local_88 == 7) {
            this->dataType_ = 0x10;
          }
          else {
            if (local_88 != 9) {
              poVar6 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                       "FileRead: The MAT-file array data format (");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_88);
              std::operator<<(poVar6,") is not supported.");
              return false;
            }
            this->dataType_ = 0x20;
          }
          iVar2 = fseek((FILE *)this->fd_,4,1);
          if (iVar2 == -1) break;
          uVar5 = ftell((FILE *)this->fd_);
          this->dataOffset_ = uVar5;
          rows._3_1_ = 1;
        }
LAB_00117eb4:
        if (((rows._3_1_ & 1) != 0) && ((rows._2_1_ & 1) != 0)) {
          chunkSize._0_1_ = 1;
          goto LAB_00117753;
        }
        iVar2 = fseek((FILE *)this->fd_,lStack_48 + columns + 8,0);
      } while (iVar2 != -1);
    }
  }
LAB_00117efb:
  poVar6 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead: Error reading MAT-file (")
  ;
  poVar6 = std::operator<<(poVar6,_doneParsing);
  std::operator<<(poVar6,") header.");
  return false;
}

Assistant:

bool FileRead :: getMatInfo( const char *fileName )
{
  // MAT-file formatting information is available at:
  // http://www.mathworks.com/access/helpdesk/help/pdf_doc/matlab/matfile_format.pdf

  // Verify this is a version 5 MAT-file format.
  char head[5];
  if ( fseek(fd_, 0, SEEK_SET) == -1 ) goto error;
  if ( fread(&head, 4, 1, fd_) != 1 ) goto error;
  // If any of the first 4 characters of the header = 0, then this is
  // a Version 4 MAT-file.
  head[4] = '\0';
  if ( strstr(head, "0") ) {
    oStream_ << "FileRead: " << fileName << " appears to be a Version 4 MAT-file, which is not currently supported.";
    return false;
  }

  // Determine the endian-ness of the file.
  char mi[2];
  byteswap_ = false;
  // Locate "M" and "I" characters in header.
  if ( fseek(fd_, 126, SEEK_SET) == -1 ) goto error;
  if ( fread(&mi, 2, 1, fd_) != 1) goto error;
#ifdef __LITTLE_ENDIAN__
  if ( !strncmp(mi, "MI", 2) )
    byteswap_ = true;
  else if ( strncmp(mi, "IM", 2) ) goto error;
#else
  if ( !strncmp(mi, "IM", 2))
    byteswap_ = true;
  else if ( strncmp(mi, "MI", 2) ) goto error;
#endif

  // We are expecting a data element containing the audio data and an
  // optional data element containing the sample rate (with an array
  // name of "fs").  Both elements should be stored as a Matlab array
  // type (14).

  bool doneParsing, haveData, haveSampleRate;
  SINT32 chunkSize, rows, columns, nametype;
  long dataoffset;
  doneParsing = false;
  haveData = false;
  haveSampleRate = false;
  while ( !doneParsing ) {

    dataoffset = ftell( fd_ ); // save location in file
    if ( findNextMatArray( &chunkSize, &rows, &columns, &nametype ) == false ) {
      // No more Matlab array type chunks found.
      if ( !haveData ) {
        oStream_ << "FileRead: No audio data found in MAT-file (" << fileName << ").";
        return false;
      }
      else if ( !haveSampleRate ) {
        fileRate_ = 44100.0;
        oStream_ << "FileRead: No sample rate found ... assuming 44100.0";
        handleError( StkError::WARNING );
        return true;
      }
      else return true;
    }

    if ( !haveSampleRate && rows == 1 && columns == 1 ) { // Parse for sample rate.

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        if ( namesize != 2 ) goto tryagain; // expecting name = "fs"
        namesize = 8; // field must be padded to multiple of 8 bytes
      }
      char name[3]; name[2] = '\0';
      if ( fread(&name, 2, 1, fd_) != 1) goto error;
      if ( strncmp(name, "fs", 2) ) goto tryagain;

      // Jump to real part data subelement, which is likely to be in a
      // small data format.
      if ( fseek(fd_, namesize-2, SEEK_CUR) == -1 ) goto error;
      UINT32 type;
      StkFloat srate;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( (type & 0xffff0000) != 0 ) // small data format
        type = (type & 0x0000ffff);
      else
        if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      if ( type == 1 ) { // SINT8
        signed char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 2 ) { // UINT8
        unsigned char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 3 ) { // SINT16
        SINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 4 ) { // UINT16
        UINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 5 ) { // SINT32
        SINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 6 ) { // UINT32
        UINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 7 ) { // FLOAT32
        FLOAT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 9 ) { // FLOAT64
        FLOAT64 rate;
        if ( fread(&rate, 8, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap64((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else
        goto tryagain;

      if ( srate > 0 ) fileRate_ = srate;
      haveSampleRate = true;
    }
    else if ( !haveData ) { // Parse for data.

      // Assume channels = smaller of rows or columns.
      if ( rows < columns ) {
        channels_ = rows;
        fileSize_ = columns;
      }
      else {
        oStream_ << "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns).";
        return false;
      }

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        namesize = (SINT32) ceil((float)namesize / 8);
        if ( fseek( fd_, namesize*8, SEEK_CUR) == -1 ) goto error;  // jump over array name
      }
      else {
        if ( fseek( fd_, 4, SEEK_CUR ) == -1 ) goto error;
      }

      // Now at real part data subelement
      SINT32 type;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( type == 1 )  dataType_ = STK_SINT8;
      else if ( type == 3 ) dataType_ = STK_SINT16;
      else if ( type == 5 ) dataType_ = STK_SINT32;
      else if ( type == 7 ) dataType_ = STK_FLOAT32;
      else if ( type == 9 ) dataType_ = STK_FLOAT64;
      else {
        oStream_ << "FileRead: The MAT-file array data format (" << type << ") is not supported.";
        return false;
      }

      // Jump to the data.
      if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      dataOffset_ = ftell(fd_);
      haveData = true;
    }

  tryagain:
    if ( haveData && haveSampleRate ) doneParsing = true;
    else // jump to end of data element and keep trying
      if ( fseek( fd_, dataoffset+chunkSize+8, SEEK_SET) == -1 ) goto error;
  }

  return true;

 error:
  oStream_ << "FileRead: Error reading MAT-file (" << fileName << ") header.";
  return false;
}